

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyn_tbl.cpp
# Opt level: O3

void dyn_tbl_copy(dyn_tbl_t *dyn_tbl_from,dyn_tbl_t *dyn_tbl_to)

{
  if (dyn_tbl_from != dyn_tbl_to) {
    std::
    _Hashtable<dyn_tbl_key_s,std::pair<dyn_tbl_key_s_const,long_long>,std::allocator<std::pair<dyn_tbl_key_s_const,long_long>>,std::__detail::_Select1st,dyn_tbl_key_eq,dyn_tbl_key_hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_assign_elements<std::_Hashtable<dyn_tbl_key_s,std::pair<dyn_tbl_key_s_const,long_long>,std::allocator<std::pair<dyn_tbl_key_s_const,long_long>>,std::__detail::_Select1st,dyn_tbl_key_eq,dyn_tbl_key_hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
              ((_Hashtable<dyn_tbl_key_s,std::pair<dyn_tbl_key_s_const,long_long>,std::allocator<std::pair<dyn_tbl_key_s_const,long_long>>,std::__detail::_Select1st,dyn_tbl_key_eq,dyn_tbl_key_hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)dyn_tbl_to,
               (_Hashtable<dyn_tbl_key_s,_std::pair<const_dyn_tbl_key_s,_long_long>,_std::allocator<std::pair<const_dyn_tbl_key_s,_long_long>_>,_std::__detail::_Select1st,_dyn_tbl_key_eq,_dyn_tbl_key_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)dyn_tbl_from);
  }
  dyn_tbl_to->decrement = dyn_tbl_from->decrement;
  dyn_tbl_to->total = dyn_tbl_from->total;
  dyn_tbl_to->max_len = dyn_tbl_from->max_len;
  dyn_tbl_to->max_value = dyn_tbl_from->max_value;
  return;
}

Assistant:

void dyn_tbl_copy(dyn_tbl_t* dyn_tbl_from, dyn_tbl_t* dyn_tbl_to) {
	dyn_tbl_to->array = dyn_tbl_from->array;
	dyn_tbl_to->decrement = dyn_tbl_from->decrement;
	dyn_tbl_to->total = dyn_tbl_from->total;
	dyn_tbl_to->max_len = dyn_tbl_from->max_len;
	dyn_tbl_to->max_value = dyn_tbl_from->max_value;
}